

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O1

ll_elem * succ(ll_head *q_head,ll_elem *n)

{
  long *plVar1;
  long lVar2;
  ll_elem *plVar3;
  ll_elem *plVar4;
  ll_elem *plVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong *puVar9;
  bool bVar10;
  
  if (((ulong)q_head & 3) != 0) {
    __assert_fail("q == ptr_clear(q)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x10e,
                  "struct ll_elem *succ(struct ll_head *, struct ll_elem *)");
  }
  puVar6 = (ulong *)((ulong)n & 0xfffffffffffffffc);
  if (puVar6 == (ulong *)0x0) {
    __assert_fail("n != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x110,
                  "struct ll_elem *succ(struct ll_head *, struct ll_elem *)");
  }
  plVar4 = (ll_elem *)*puVar6;
  do {
    LOCK();
    plVar3 = (ll_elem *)*puVar6;
    bVar10 = plVar4 == plVar3;
    if (bVar10) {
      *puVar6 = (ulong)plVar4 | 1;
      plVar3 = plVar4;
    }
    UNLOCK();
    plVar4 = plVar3;
  } while (!bVar10);
  while (((ulong)plVar3 & 1) != 0) {
    plVar4 = (ll_elem *)*puVar6;
    do {
      LOCK();
      plVar3 = (ll_elem *)*puVar6;
      bVar10 = plVar4 == plVar3;
      if (bVar10) {
        *puVar6 = (ulong)plVar4 | 1;
        plVar3 = plVar4;
      }
      UNLOCK();
      plVar4 = plVar3;
    } while (!bVar10);
  }
  puVar9 = (ulong *)((ulong)plVar3 & 0xfffffffffffffffc);
  if (puVar9 != (ulong *)0x0) {
    LOCK();
    puVar9[2] = puVar9[2] + 1;
    UNLOCK();
  }
  LOCK();
  uVar7 = *puVar6;
  *puVar6 = *puVar6 & 0xfffffffffffffffe;
  UNLOCK();
  if ((uVar7 & 1) != 0) {
    if (puVar9 != (ulong *)0x0) {
      uVar7 = puVar9[1];
      while ((uVar7 & 2) != 0) {
        uVar7 = *puVar9;
        do {
          LOCK();
          uVar8 = *puVar9;
          bVar10 = uVar7 == uVar8;
          if (bVar10) {
            *puVar9 = uVar7 | 1;
            uVar8 = uVar7;
          }
          UNLOCK();
          uVar7 = uVar8;
        } while (!bVar10);
        while ((uVar8 & 1) != 0) {
          uVar7 = *puVar9;
          do {
            LOCK();
            uVar8 = *puVar9;
            bVar10 = uVar7 == uVar8;
            if (bVar10) {
              *puVar9 = uVar7 | 1;
              uVar8 = uVar7;
            }
            UNLOCK();
            uVar7 = uVar8;
          } while (!bVar10);
        }
        uVar8 = uVar8 & 0xfffffffffffffffc;
        if (uVar8 != 0) {
          LOCK();
          *(long *)(uVar8 + 0x10) = *(long *)(uVar8 + 0x10) + 1;
          UNLOCK();
        }
        LOCK();
        uVar7 = *puVar9;
        *puVar9 = *puVar9 & 0xfffffffffffffffe;
        UNLOCK();
        if ((uVar7 & 1) == 0) goto LAB_001019c7;
        if (((ulong)plVar3 & 1) != 0) {
          __assert_fail("!((uintptr_t)old & DEREF)",
                        "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                        0xdb,"int ptr_cas(elem_ptr_t *, struct ll_elem **, struct ll_elem *)");
        }
        plVar5 = (ll_elem *)((uint)plVar3 & 2 | uVar8);
        LOCK();
        plVar4 = (ll_elem *)*puVar6;
        bVar10 = plVar3 == plVar4;
        if (bVar10) {
          *puVar6 = (ulong)plVar5 | 1;
          plVar4 = plVar3;
        }
        UNLOCK();
        if ((ll_elem *)((ulong)plVar4 & 0xfffffffffffffffe) == plVar3 && !bVar10) {
          do {
            LOCK();
            plVar4 = (ll_elem *)*puVar6;
            bVar10 = plVar3 == plVar4;
            if (bVar10) {
              *puVar6 = (ulong)plVar5 | 1;
              plVar4 = plVar3;
            }
            UNLOCK();
          } while ((!bVar10) && ((ll_elem *)((ulong)plVar4 & 0xfffffffffffffffe) == plVar3));
        }
        if (bVar10) {
          LOCK();
          *(long *)(uVar8 + 0x10) = *(long *)(uVar8 + 0x10) + 1;
          UNLOCK();
          LOCK();
          uVar7 = *puVar6;
          *puVar6 = *puVar6 & 0xfffffffffffffffe;
          UNLOCK();
          if ((uVar7 & 1) == 0) {
            __assert_fail("p & DEREF",
                          "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c"
                          ,0xf5,"void ptr_clear_deref(elem_ptr_t *)");
          }
          LOCK();
          puVar9 = puVar9 + 2;
          uVar7 = *puVar9;
          *puVar9 = *puVar9 - 2;
          UNLOCK();
          if (uVar7 < 2) goto LAB_001019e6;
        }
        else {
          LOCK();
          puVar9 = puVar9 + 2;
          uVar7 = *puVar9;
          *puVar9 = *puVar9 - 1;
          UNLOCK();
          if (uVar7 == 0) {
LAB_001019e6:
            __assert_fail("old >= count",
                          "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c"
                          ,0x9a,"void deref_release(struct ll_head *, struct ll_elem *, size_t)");
          }
          LOCK();
          plVar1 = (long *)(uVar8 + 0x10);
          lVar2 = *plVar1;
          *plVar1 = *plVar1 + -1;
          UNLOCK();
          if (lVar2 == 0) goto LAB_001019e6;
          plVar4 = (ll_elem *)*puVar6;
          do {
            LOCK();
            plVar5 = (ll_elem *)*puVar6;
            bVar10 = plVar4 == plVar5;
            if (bVar10) {
              *puVar6 = (ulong)plVar4 | 1;
              plVar5 = plVar4;
            }
            UNLOCK();
            plVar4 = plVar5;
          } while (!bVar10);
          while (((ulong)plVar5 & 1) != 0) {
            plVar4 = (ll_elem *)*puVar6;
            do {
              LOCK();
              plVar5 = (ll_elem *)*puVar6;
              bVar10 = plVar4 == plVar5;
              if (bVar10) {
                *puVar6 = (ulong)plVar4 | 1;
                plVar5 = plVar4;
              }
              UNLOCK();
              plVar4 = plVar5;
            } while (!bVar10);
          }
          if (((ulong)plVar5 & 0xfffffffffffffffc) != 0) {
            LOCK();
            plVar1 = (long *)(((ulong)plVar5 & 0xfffffffffffffffc) + 0x10);
            *plVar1 = *plVar1 + 1;
            UNLOCK();
          }
          LOCK();
          uVar7 = *puVar6;
          *puVar6 = *puVar6 & 0xfffffffffffffffe;
          UNLOCK();
          if ((uVar7 & 1) == 0) goto LAB_001019c7;
        }
        puVar9 = (ulong *)((ulong)plVar5 & 0xfffffffffffffffc);
        plVar3 = plVar5;
        uVar7 = puVar9[1];
      }
    }
    return plVar3;
  }
LAB_001019c7:
  __assert_fail("old & DEREF",
                "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0xb0,
                "struct ll_elem *deref(elem_ptr_t *)");
}

Assistant:

static struct ll_elem*
succ(struct ll_head *q_head, struct ll_elem *n)
{
	struct ll_elem	*q, *s, *s_, *ss;

	q = &q_head->q;
	assert(q == ptr_clear(q));
	n = ptr_clear(n);
	assert(n != NULL);

	s = deref(&n->succ);
	/* If s is null, n is not on the queue. */
	if (ptr_clear(s) == NULL)
		return s;

	while (deleted(s)) {
		ss = flag_combine(deref(&ptr_clear(s)->succ), s);
		s_ = s;
		if (ptr_cas(&n->succ, &s_, ss)) {
			/* cas succeeded */
			deref_acquire(ss, 1);
			ptr_clear_deref(&n->succ);

			/* Release s:
			 * - once for n->succ
			 * - once because we no longer claim s.
			 */
			deref_release(q_head, s, 2);
			s = ss;
		} else {
			/* cas failed */
			deref_release(q_head, s, 1);
			deref_release(q_head, ss, 1);

			/*
			 * Cannot do s = s_, since we do not have the lock on
			 * n->succ at the moment and thus cannot acquire the
			 * reference counter on s_.
			 */
			s = deref(&n->succ);
		}
	}

	return s;
}